

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_ModuleEnumerator.cpp
# Opt level: O0

bool __thiscall
axl::sys::lnx::EnumeratorModulesParser::processModule
          (EnumeratorModulesParser *this,StringRef *name,size_t size,size_t useCount,
          ModuleState state,size_t offset)

{
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  ModuleDesc *moduleDesc;
  StringRef *in_stack_ffffffffffffff98;
  ModuleDesc *in_stack_ffffffffffffffb0;
  ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
  *in_stack_ffffffffffffffb8;
  
  pvVar1 = operator_new(0x50);
  ModuleDesc::ModuleDesc((ModuleDesc *)0x1aaa06);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
            (in_RDI,in_stack_ffffffffffffff98);
  *(undefined8 *)((long)pvVar1 + 0x30) = in_RDX;
  *(undefined8 *)((long)pvVar1 + 0x38) = in_RCX;
  *(undefined4 *)((long)pvVar1 + 0x48) = in_R8D;
  *(undefined8 *)((long)pvVar1 + 0x40) = in_R9;
  sl::
  ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
  ::insertTail(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return true;
}

Assistant:

bool
	processModule(
		const sl::StringRef& name,
		size_t size,
		size_t useCount,
		ModuleState state,
		size_t offset
	) {
		ModuleDesc* moduleDesc = new ModuleDesc;
		moduleDesc->m_name = name;
		moduleDesc->m_size = size;
		moduleDesc->m_useCount = useCount;
		moduleDesc->m_state = state;
		moduleDesc->m_offset = offset;
		m_moduleList->insertTail(moduleDesc);
		return true;
	}